

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O1

int findnexte(int M)

{
  int iVar1;
  uint M_00;
  
  do {
    M_00 = M;
    iVar1 = factorf(M_00);
    M = M_00 + 1;
  } while ((M_00 & 1) != 0 || iVar1 != 1);
  return M_00;
}

Assistant:

int findnexte(int M) {
	int N;
	N = M;

	while (factorf(N) != 1 || N%2 != 0) {
		++N;
	}

	return N;

}